

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__horizontal_gather_4_channels_with_11_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float *pfVar57;
  long lVar58;
  
  pfVar1 = output_buffer + (output_sub_size << 2);
  pfVar57 = horizontal_coefficients + 8;
  do {
    lVar58 = (long)horizontal_contributors->n0;
    fVar13 = pfVar57[-8];
    fVar14 = pfVar57[-7];
    fVar15 = pfVar57[-6];
    fVar16 = pfVar57[-5];
    pfVar2 = decode_buffer + lVar58 * 4;
    fVar17 = pfVar2[1];
    fVar18 = pfVar2[2];
    fVar19 = pfVar2[3];
    pfVar3 = decode_buffer + lVar58 * 4 + 4;
    fVar20 = pfVar3[1];
    fVar21 = pfVar3[2];
    fVar22 = pfVar3[3];
    pfVar4 = decode_buffer + lVar58 * 4 + 8;
    fVar23 = pfVar4[1];
    fVar24 = pfVar4[2];
    fVar25 = pfVar4[3];
    pfVar5 = decode_buffer + lVar58 * 4 + 0xc;
    fVar26 = pfVar5[1];
    fVar27 = pfVar5[2];
    fVar28 = pfVar5[3];
    fVar29 = pfVar57[-4];
    fVar30 = pfVar57[-3];
    fVar31 = pfVar57[-2];
    fVar32 = pfVar57[-1];
    pfVar6 = decode_buffer + lVar58 * 4 + 0x10;
    fVar33 = pfVar6[1];
    fVar34 = pfVar6[2];
    fVar35 = pfVar6[3];
    pfVar7 = decode_buffer + lVar58 * 4 + 0x14;
    fVar36 = pfVar7[1];
    fVar37 = pfVar7[2];
    fVar38 = pfVar7[3];
    pfVar8 = decode_buffer + lVar58 * 4 + 0x18;
    fVar39 = pfVar8[1];
    fVar40 = pfVar8[2];
    fVar41 = pfVar8[3];
    pfVar9 = decode_buffer + lVar58 * 4 + 0x1c;
    fVar42 = pfVar9[1];
    fVar43 = pfVar9[2];
    fVar44 = pfVar9[3];
    fVar45 = *pfVar57;
    fVar46 = pfVar57[1];
    fVar47 = pfVar57[2];
    pfVar10 = decode_buffer + lVar58 * 4 + 0x20;
    fVar48 = pfVar10[1];
    fVar49 = pfVar10[2];
    fVar50 = pfVar10[3];
    pfVar11 = decode_buffer + lVar58 * 4 + 0x24;
    fVar51 = pfVar11[1];
    fVar52 = pfVar11[2];
    fVar53 = pfVar11[3];
    pfVar12 = decode_buffer + lVar58 * 4 + 0x28;
    fVar54 = pfVar12[1];
    fVar55 = pfVar12[2];
    fVar56 = pfVar12[3];
    *output_buffer =
         fVar47 * *pfVar12 +
         *pfVar10 * fVar45 +
         fVar31 * *pfVar8 + *pfVar6 * fVar29 + fVar15 * *pfVar4 + *pfVar2 * fVar13 +
         fVar46 * *pfVar11 +
         fVar32 * *pfVar9 + fVar30 * *pfVar7 + fVar16 * *pfVar5 + fVar14 * *pfVar3;
    output_buffer[1] =
         fVar47 * fVar54 +
         fVar48 * fVar45 + fVar31 * fVar39 + fVar33 * fVar29 + fVar15 * fVar23 + fVar17 * fVar13 +
         fVar46 * fVar51 + fVar32 * fVar42 + fVar30 * fVar36 + fVar16 * fVar26 + fVar14 * fVar20;
    output_buffer[2] =
         fVar47 * fVar55 +
         fVar49 * fVar45 + fVar31 * fVar40 + fVar34 * fVar29 + fVar15 * fVar24 + fVar18 * fVar13 +
         fVar46 * fVar52 + fVar32 * fVar43 + fVar30 * fVar37 + fVar16 * fVar27 + fVar14 * fVar21;
    output_buffer[3] =
         fVar47 * fVar56 +
         fVar50 * fVar45 + fVar31 * fVar41 + fVar35 * fVar29 + fVar15 * fVar25 + fVar19 * fVar13 +
         fVar46 * fVar53 + fVar32 * fVar44 + fVar30 * fVar38 + fVar16 * fVar28 + fVar14 * fVar22;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 4;
    pfVar57 = pfVar57 + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_11_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  stbir__3_coeff_setup();
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__4_coeff_continue_from_4(4);
    stbir__3_coeff_remnant(8);
    stbir__store_output();
  } while ( output < output_end );
}